

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_NoCtypeFromEdition2024_Test::
FeaturesTest_NoCtypeFromEdition2024_Test(FeaturesTest_NoCtypeFromEdition2024_Test *this)

{
  FeaturesTest::FeaturesTest(&this->super_FeaturesTest);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_015fb4a8;
  return;
}

Assistant:

TEST_F(FeaturesTest, NoCtypeFromEdition2024) {
  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2024
        message_type {
          name: "Foo"
          field { name: "foo" number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 }
          field {
            name: "bar"
            number: 2
            label: LABEL_OPTIONAL
            type: TYPE_STRING
            options { ctype: CORD }
          }
        }
      )pb",
      "foo.proto: Foo.bar: TYPE: ctype option is not allowed under edition "
      "2024 and beyond. Use the feature string_type = VIEW|CORD|STRING|... "
      "instead.\n");
}